

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O1

void __thiscall
aeron::archive::AeronArchive::pollNextResponse
          (AeronArchive *this,int64_t correlationId,TimePoint *deadline)

{
  element_type *peVar1;
  ClientConductor *this_00;
  bool bVar2;
  int iVar3;
  long lVar4;
  SourcedException *this_01;
  char *pcVar5;
  byte *in_RCX;
  TimePoint *extraout_RDX;
  TimePoint *extraout_RDX_00;
  TimePoint *extraout_RDX_01;
  TimePoint *__nfds;
  allocator local_b9;
  int64_t local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  __nfds = deadline;
  local_b8 = correlationId;
  do {
    iVar3 = ControlResponsePoller::poll
                      ((this->controlResponsePoller_)._M_t.
                       super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                       .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                       _M_head_impl,(pollfd *)correlationId,(nfds_t)__nfds,(int)in_RCX);
    bVar2 = ControlResponsePoller::isPollComplete
                      ((this->controlResponsePoller_)._M_t.
                       super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                       .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                       _M_head_impl);
    __nfds = extraout_RDX;
    if (iVar3 < 1 && !bVar2) {
      correlationId =
           (int64_t)(this->controlResponsePoller_)._M_t.
                    super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                    .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                    _M_head_impl;
      ControlResponsePoller::subscription((ControlResponsePoller *)correlationId);
      in_RCX = *(byte **)(local_b0._M_dataplus._M_p + 0x50);
      lVar4 = *(long *)(in_RCX + 8);
      if (lVar4 != 0) {
        in_RCX = (byte *)(*(long *)in_RCX + 0xd0);
        do {
          lVar4 = lVar4 + -1;
          correlationId = CONCAT71((int7)((ulong)correlationId >> 8),*in_RCX);
          if ((*in_RCX & 1) == 0) break;
          in_RCX = in_RCX + 0x128;
        } while (lVar4 != 0);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._M_string_length);
      }
      lVar4 = std::chrono::_V2::system_clock::now();
      if ((deadline->__d).__r < lVar4) {
        this_01 = (SourcedException *)__cxa_allocate_exception(0x48);
        std::__cxx11::to_string(&local_50,local_b8);
        std::operator+(&local_b0,"awaiting response for correlationId=",&local_50);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,
                   "void aeron::archive::AeronArchive::pollNextResponse(std::int64_t, const TimePoint &)"
                   ,"");
        pcVar5 = aeron::util::past_prefix
                           ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp"
                           );
        std::__cxx11::string::string((string *)&local_70,pcVar5,&local_b9);
        aeron::util::SourcedException::SourcedException(this_01,&local_b0,&local_90,&local_70,0x18c)
        ;
        *(undefined ***)this_01 = &PTR__SourcedException_00162228;
        __cxa_throw(this_01,&ArchiveException::typeinfo,
                    aeron::util::SourcedException::~SourcedException);
      }
      sched_yield();
      peVar1 = (this->aeron_).super___shared_ptr<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      __nfds = extraout_RDX_00;
      if ((peVar1->m_conductorInvoker).m_isRunning == true) {
        this_00 = (peVar1->m_conductorInvoker).m_agent;
        DriverListenerAdapter<aeron::ClientConductor>::receiveMessages
                  (&this_00->m_driverListenerAdapter);
        ClientConductor::onHeartbeatCheckTimeouts(this_00);
        __nfds = extraout_RDX_01;
      }
    }
    if (bVar2) {
      return;
    }
  } while( true );
}

Assistant:

void AeronArchive::pollNextResponse(std::int64_t correlationId, const TimePoint& deadline) {
    while (true) {
        std::int32_t fragments = controlResponsePoller_->poll();

        if (controlResponsePoller_->isPollComplete()) {
            break;
        }

        if (fragments > 0) {
            continue;
        }

        if (!controlResponsePoller_->subscription()->isConnected()) {
            throw ArchiveException("subscription to archive is not connected", SOURCEINFO);
        }

        if (Clock::now() > deadline) {
            throw ArchiveException("awaiting response for correlationId=" + std::to_string(correlationId), SOURCEINFO);
        }

        idleStrategy_.idle();
        aeron_->conductorAgentInvoker().invoke();
    }
}